

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O1

RunResult __thiscall
wabt::interp::Thread::DoAtomicRmw<unsigned_int,unsigned_int>
          (Thread *this,BinopFunc<unsigned_int,_unsigned_int> *f,Instr instr,Ptr *out_trap)

{
  Store *this_00;
  Result RVar1;
  undefined8 extraout_RDX;
  RunResult RVar2;
  Value VVar3;
  Value VVar4;
  uint local_9c;
  RefPtr<wabt::interp::Memory> local_98;
  Ptr *local_78;
  BinopFunc<unsigned_int,_unsigned_int> *local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  RefPtr<wabt::interp::Trap> local_48;
  
  local_78 = out_trap;
  local_70 = f;
  RefPtr<wabt::interp::Memory>::RefPtr
            (&local_98,this->store_,
             (Ref)(this->inst_->memories_).
                  super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                  super__Vector_impl_data._M_start[instr.field_2.imm_u32].index);
  VVar3 = Pop(this);
  VVar4 = Pop(this);
  RVar1 = Memory::AtomicRmw<unsigned_int,unsigned_int(*&)(unsigned_int,unsigned_int)>
                    (local_98.obj_,VVar4.i32_,instr.field_2.imm_u32x2.snd,VVar3.i32_,&local_70,
                     &local_9c);
  if (RVar1.enum_ == Error) {
    this_00 = this->store_;
    StringPrintf_abi_cxx11_
              (&local_68,"invalid atomic access at %u+%u",VVar4.i64_ & 0xffffffff,
               (ulong)instr.field_2.imm_u32x2.snd);
    Store::
    Alloc<wabt::interp::Trap,wabt::interp::Store&,std::__cxx11::string_const&,std::vector<wabt::interp::Frame,std::allocator<wabt::interp::Frame>>const&>
              (&local_48,this_00,this_00,&local_68,&this->frames_);
    local_78->obj_ = local_48.obj_;
    local_78->store_ = local_48.store_;
    local_78->root_index_ = local_48.root_index_;
    local_48.obj_ = (Trap *)0x0;
    local_48.store_ = (Store *)0x0;
    local_48.root_index_ = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    RVar2 = Trap;
  }
  else {
    VVar3.i64_._4_4_ = 0;
    VVar3.i32_ = local_9c;
    VVar3._8_8_ = extraout_RDX;
    Push(this,VVar3);
    RVar2 = Ok;
  }
  if (local_98.obj_ != (Memory *)0x0) {
    FreeList<wabt::interp::Ref>::Delete(&(local_98.store_)->roots_,local_98.root_index_);
  }
  return RVar2;
}

Assistant:

RunResult Thread::DoAtomicRmw(BinopFunc<T, T> f,
                              Instr instr,
                              Trap::Ptr* out_trap) {
  Memory::Ptr memory{store_, inst_->memories()[instr.imm_u32x2.fst]};
  T val = Pop<T>();
  u32 offset = Pop<u32>();
  T old;
  TRAP_IF(Failed(memory->AtomicRmw(offset, instr.imm_u32x2.snd, val, f, &old)),
          StringPrintf("invalid atomic access at %u+%u", offset,
                       instr.imm_u32x2.snd));
  Push(static_cast<R>(old));
  return RunResult::Ok;
}